

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O3

void * canvas_undo_set_arrange(_glist *x,t_gobj *obj,int newindex)

{
  _gobj *p_Var1;
  t_selection *ptVar2;
  int *piVar3;
  _gobj *p_Var4;
  int iVar5;
  
  if ((x->field_0xe8 & 0x20) == 0) {
    canvas_editmode(x,1.0);
  }
  if (x->gl_editor != (t_editor *)0x0) {
    for (ptVar2 = x->gl_editor->e_selection; ptVar2 != (t_selection *)0x0; ptVar2 = ptVar2->sel_next
        ) {
      if (ptVar2->sel_what == obj) goto LAB_0013ba01;
    }
  }
  glist_select(x,obj);
LAB_0013ba01:
  piVar3 = (int *)getbytes(8);
  if (newindex == 0) {
    piVar3[1] = 0;
    p_Var4 = x->gl_list;
  }
  else {
    iVar5 = -1;
    p_Var4 = x->gl_list;
    for (p_Var1 = p_Var4; p_Var1 != (t_gobj *)0x0; p_Var1 = p_Var1->g_next) {
      iVar5 = iVar5 + 1;
    }
    piVar3[1] = iVar5;
  }
  iVar5 = 0;
  if (p_Var4 != obj && p_Var4 != (t_gobj *)0x0) {
    iVar5 = 0;
    do {
      iVar5 = iVar5 + 1;
      p_Var4 = p_Var4->g_next;
      if (p_Var4 == (_gobj *)0x0) break;
    } while (p_Var4 != obj);
  }
  *piVar3 = iVar5;
  return piVar3;
}

Assistant:

void *canvas_undo_set_arrange(t_canvas *x, t_gobj *obj, int newindex)
{
        /* newindex tells us is the new index at the beginning (0) or the end (1) */

    t_undo_arrange *buf;
        /* enable editor (in case it is disabled) and select the object
           we are working on */
    if (!x->gl_edit)
        canvas_editmode(x, 1);

        /* select the object*/
    if (!glist_isselected(x, obj))
        glist_select(x, obj);

    buf = (t_undo_arrange *)getbytes(sizeof(*buf));

        /* set the u_newindex appropriately */
    if (newindex == 0) buf->u_newindex = 0;
    else buf->u_newindex = glist_getindex(x, 0) - 1;

        /* store index of the currently selected object */
    buf->u_previndex = glist_getindex(x, obj);

    return (buf);
}